

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Builder * __thiscall
capnproto_test::capnp::test::TestGroups::Groups::Builder::initBar
          (Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = ::capnp::bounded<2u>();
  ::capnp::_::StructBuilder::setDataField<capnproto_test::capnp::test::TestGroups::Groups::Which>
            (&this->_builder,uVar1,BAR);
  uVar1 = ::capnp::bounded<0u>();
  ::capnp::_::StructBuilder::setDataField<unsigned_int>(&this->_builder,uVar1,0);
  uVar1 = ::capnp::bounded<1u>();
  ::capnp::_::StructBuilder::setDataField<unsigned_long>(&this->_builder,uVar1,0);
  uVar1 = ::capnp::bounded<0u>();
  ::capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  ::capnp::_::PointerBuilder::clear(&local_28);
  memcpy(&local_50,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_48;
  base.segment = (SegmentBuilder *)local_50;
  base.data = (void *)local_40;
  base.pointers = (WirePointer *)uStack_38;
  base.dataSize = (undefined4)local_30;
  base.pointerCount = local_30._4_2_;
  base._38_2_ = local_30._6_2_;
  Bar::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename TestGroups::Groups::Bar::Builder TestGroups::Groups::Builder::initBar() {
  _builder.setDataField<TestGroups::Groups::Which>(
      ::capnp::bounded<2>() * ::capnp::ELEMENTS, TestGroups::Groups::BAR);
  _builder.setDataField< ::uint32_t>(::capnp::bounded<0>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField< ::uint64_t>(::capnp::bounded<1>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<0>() * ::capnp::POINTERS).clear();
  return typename TestGroups::Groups::Bar::Builder(_builder);
}